

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

bool __thiscall libcellml::XmlNode::isBasicReal(XmlNode *this)

{
  bool bVar1;
  string sStack_28;
  
  convertToStrippedString_abi_cxx11_(&sStack_28,this);
  bVar1 = canConvertToBasicDouble(&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return bVar1;
}

Assistant:

bool XmlNode::isBasicReal() const
{
    return canConvertToBasicDouble(convertToStrippedString());
}